

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O1

FaceData * __thiscall
Ptex::v2_4::PtexReader::TiledFaceBase::reduce
          (TiledFaceBase *this,PtexReader *r,Res newres,ReduceFn *reducefn,size_t *newMemUsed)

{
  Res RVar1;
  uint32_t uVar2;
  DataType DVar3;
  _func_int *p_Var4;
  code *pcVar5;
  long lVar6;
  ReduceFn *pRVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  undefined4 extraout_var;
  void *pvVar12;
  void *__s2;
  TiledFaceBase *pTVar13;
  PtexReader *pPVar14;
  EVP_PKEY_CTX *dst;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  int iVar18;
  undefined6 in_register_00000012;
  EVP_PKEY_CTX *src;
  uint uVar19;
  int iVar20;
  undefined8 *puVar21;
  ulong uVar22;
  long lVar23;
  bool bVar24;
  undefined8 uStack_90;
  DataType aDStack_88 [2];
  ulong uStack_80;
  void *local_78;
  ReduceFn *local_70;
  TiledFaceBase *local_68;
  size_t *local_60;
  int local_54;
  undefined8 *local_50;
  uint local_48;
  int local_44;
  int local_40;
  int local_3c;
  uint local_38;
  uint local_34;
  long *plVar11;
  
  bVar16 = newres.vlog2;
  uVar2 = (r->_header).meshtype;
  bVar15 = newres.ulog2;
  local_38 = (uint)bVar16;
  local_3c = (int)CONCAT62(in_register_00000012,newres);
  uVar19 = local_38;
  bVar17 = bVar15;
  if (uVar2 != 0) {
    RVar1 = this->_tileres;
    bVar17 = RVar1.ulog2;
    if ((char)bVar15 <= RVar1.ulog2) {
      bVar17 = bVar15;
    }
    uVar19 = (uint)((ushort)RVar1 >> 8);
    if ((char)bVar16 <= RVar1.vlog2) {
      uVar19 = (uint)bVar16;
    }
  }
  local_70 = reducefn;
  if ((1 << (bVar15 - bVar17 & 0x1f)) << (bVar16 - (char)uVar19 & 0x1f) == 1) {
    iVar9 = this->_ntiles;
    lVar6 = -((long)iVar9 * 8 + 0xfU & 0xfffffffffffffff0);
    local_50 = (undefined8 *)((long)&local_78 + lVar6);
    bVar24 = true;
    local_60 = newMemUsed;
    if (0 < (long)iVar9) {
      uVar22 = 0;
      do {
        p_Var4 = (this->super_FaceData).super_PtexFaceData._vptr_PtexFaceData[9];
        *(undefined8 *)((long)&uStack_80 + lVar6) = 0x107e4b;
        iVar9 = (*p_Var4)(this,uVar22 & 0xffffffff);
        plVar11 = (long *)CONCAT44(extraout_var,iVar9);
        local_50[uVar22] = plVar11;
        if (bVar24) {
          pcVar5 = *(code **)(*plVar11 + 0x18);
          *(undefined8 *)((long)&uStack_80 + lVar6) = 0x107e65;
          cVar8 = (*pcVar5)(plVar11);
          if (cVar8 == '\0') goto LAB_00107e9e;
          if (uVar22 == 0) {
            bVar24 = true;
          }
          else {
            pcVar5 = *(code **)(*(long *)*local_50 + 0x30);
            *(undefined8 *)((long)&uStack_80 + lVar6) = 0x107e7b;
            pvVar12 = (void *)(*pcVar5)();
            pcVar5 = *(code **)(*plVar11 + 0x30);
            *(undefined8 *)((long)&uStack_80 + lVar6) = 0x107e87;
            __s2 = (void *)(*pcVar5)(plVar11);
            iVar9 = this->_pixelsize;
            *(undefined8 *)((long)&uStack_80 + lVar6) = 0x107e96;
            iVar9 = bcmp(pvVar12,__s2,(long)iVar9);
            bVar24 = iVar9 == 0;
          }
        }
        else {
LAB_00107e9e:
          bVar24 = false;
        }
        uVar22 = uVar22 + 1;
        iVar9 = this->_ntiles;
      } while ((long)uVar22 < (long)iVar9);
    }
    iVar18 = local_3c;
    if (bVar24) {
      *(undefined8 *)((long)&uStack_80 + lVar6) = 0x107f1f;
      pTVar13 = (TiledFaceBase *)operator_new(0x18);
      iVar9 = this->_pixelsize;
      (pTVar13->super_FaceData)._res.ulog2 = '\0';
      (pTVar13->super_FaceData)._res.vlog2 = '\0';
      (pTVar13->super_FaceData).super_PtexFaceData._vptr_PtexFaceData =
           (_func_int **)&PTR__PackedFace_0011d598;
      *(int *)&(pTVar13->super_FaceData).field_0xc = iVar9;
      *(undefined8 *)((long)&uStack_80 + lVar6) = 0x107f3f;
      pPVar14 = (PtexReader *)operator_new__((long)iVar9);
      puVar21 = local_50;
      pTVar13->_reader = pPVar14;
      (pTVar13->super_FaceData).super_PtexFaceData._vptr_PtexFaceData =
           (_func_int **)&PTR__PackedFace_0011d618;
      pcVar5 = *(code **)(*(long *)*local_50 + 0x30);
      local_68 = pTVar13;
      *(undefined8 *)((long)&uStack_80 + lVar6) = 0x107f62;
      pvVar12 = (void *)(*pcVar5)();
      iVar9 = this->_pixelsize;
      *(undefined8 *)((long)&uStack_80 + lVar6) = 0x107f74;
      memcpy(pPVar14,pvVar12,(long)iVar9);
      *local_60 = (long)iVar9 + 0x18;
    }
    else if (uVar2 == 0) {
      bVar17 = (this->_tileres).ulog2;
      bVar15 = (this->_tileres).vlog2;
      local_54 = 1 << (bVar17 & 0x1f);
      local_44 = 1 << (bVar15 & 0x1f);
      iVar18 = this->_pixelsize;
      local_34 = iVar18 << (bVar17 & 0x1f);
      iVar20 = this->_ntilesu;
      local_40 = local_34 * iVar20;
      local_48 = local_40 << (bVar15 & 0x1f);
      iVar10 = local_54 << (bVar15 & 0x1f);
      *(undefined8 *)((long)&uStack_80 + lVar6) = 0x108151;
      pvVar12 = operator_new__((long)(iVar9 * iVar18 * iVar10));
      local_78 = pvVar12;
      if (0 < this->_ntiles) {
        local_48 = local_48 - (iVar20 + -1) * local_34;
        uVar22 = 0;
        do {
          plVar11 = (long *)local_50[uVar22];
          pcVar5 = *(code **)(*plVar11 + 0x18);
          *(undefined8 *)((long)&uStack_80 + lVar6) = 0x108183;
          cVar8 = (*pcVar5)(plVar11);
          pcVar5 = *(code **)(*plVar11 + 0x30);
          *(undefined8 *)((long)&uStack_80 + lVar6) = 0x10818f;
          dst = (EVP_PKEY_CTX *)(*pcVar5)(plVar11);
          iVar20 = local_40;
          iVar18 = local_44;
          iVar9 = local_54;
          if (cVar8 == '\0') {
            src = (EVP_PKEY_CTX *)(ulong)local_34;
            *(undefined8 *)((long)&uStack_80 + lVar6) = 0x1081c7;
            PtexUtils::copy(dst,src);
          }
          else {
            iVar10 = this->_pixelsize;
            *(undefined8 *)((long)&uStack_80 + lVar6) = 0x1081ad;
            PtexUtils::fill(dst,pvVar12,iVar20,iVar9,iVar18,iVar10);
          }
          uVar22 = uVar22 + 1;
          uVar19 = local_48;
          if ((int)((long)((ulong)(uint)((int)uVar22 >> 0x1f) << 0x20 | uVar22 & 0xffffffff) %
                   (long)this->_ntilesu) != 0) {
            uVar19 = local_34;
          }
          pvVar12 = (void *)((long)pvVar12 + (long)(int)uVar19);
        } while ((long)uVar22 < (long)this->_ntiles);
      }
      iVar18 = local_3c;
      iVar9 = this->_pixelsize;
      bVar16 = (byte)local_3c;
      bVar17 = (byte)local_38;
      *(undefined8 *)((long)&uStack_80 + lVar6) = 0x108211;
      pTVar13 = (TiledFaceBase *)operator_new(0x18);
      (pTVar13->super_FaceData)._res = SUB42(iVar18,0);
      (pTVar13->super_FaceData).super_PtexFaceData._vptr_PtexFaceData =
           (_func_int **)&PTR__PackedFace_0011d598;
      *(int *)&(pTVar13->super_FaceData).field_0xc = iVar9;
      uVar22 = (ulong)(((1 << (bVar16 & 0x1f)) << (bVar17 & 0x1f)) * iVar9);
      *(undefined8 *)((long)&uStack_80 + lVar6) = 0x108233;
      pPVar14 = (PtexReader *)operator_new__(uVar22);
      pvVar12 = local_78;
      local_68 = pTVar13;
      pTVar13->_reader = pPVar14;
      *local_60 = uVar22 + 0x18;
      bVar17 = (this->super_FaceData)._res.ulog2;
      bVar15 = (this->super_FaceData)._res.vlog2;
      DVar3 = this->_dt;
      *(ulong *)((long)&uStack_80 + lVar6) = (ulong)(uint)this->_nchan;
      *(ulong *)((long)aDStack_88 + lVar6) = (ulong)DVar3;
      pRVar7 = local_70;
      *(undefined8 *)((long)&uStack_90 + lVar6) = 0x108289;
      (*pRVar7)(pvVar12,iVar9 << (bVar17 & 0x1f),1 << (bVar17 & 0x1f),1 << (bVar15 & 0x1f),pPVar14,
                iVar9 << (bVar16 & 0x1f),*(DataType *)((long)aDStack_88 + lVar6),
                *(int *)((long)&uStack_80 + lVar6));
      *(undefined8 *)((long)&uStack_80 + lVar6) = 0x108295;
      operator_delete__(pvVar12);
      puVar21 = local_50;
    }
    else {
      bVar15 = (byte)local_3c;
      local_48 = 1 << (bVar15 & 0x1f);
      uVar19 = this->_pixelsize;
      iVar9 = local_48 << ((byte)local_38 & 0x1f);
      *(undefined8 *)((long)&uStack_80 + lVar6) = 0x107fb4;
      pTVar13 = (TiledFaceBase *)operator_new(0x18);
      (pTVar13->super_FaceData)._res = SUB42(iVar18,0);
      (pTVar13->super_FaceData).super_PtexFaceData._vptr_PtexFaceData =
           (_func_int **)&PTR__PackedFace_0011d598;
      *(uint *)&(pTVar13->super_FaceData).field_0xc = uVar19;
      uVar22 = (ulong)(int)(iVar9 * uVar19);
      local_34 = uVar19;
      *(undefined8 *)((long)&uStack_80 + lVar6) = 0x107fda;
      pPVar14 = (PtexReader *)operator_new__(uVar22);
      pTVar13->_reader = pPVar14;
      *local_60 = uVar22 + 0x18;
      bVar17 = (this->_tileres).ulog2;
      local_44 = 1 << (bVar17 & 0x1f);
      local_40 = 1 << ((this->_tileres).vlog2 & 0x1fU);
      local_54 = local_34 << (bVar17 & 0x1f);
      uVar19 = local_34 << (bVar15 & 0x1f);
      iVar9 = (int)uVar19 / this->_ntilesu;
      puVar21 = local_50;
      local_68 = pTVar13;
      if (0 < this->_ntiles) {
        local_60 = (size_t *)CONCAT44(local_60._4_4_,iVar9);
        local_3c = (int)(uVar19 << ((byte)local_38 & 0x1f)) / this->_ntilesv -
                   (this->_ntilesu + -1) * iVar9;
        uVar22 = 0;
        local_38 = 1 << ((byte)local_38 & 0x1f);
        local_34 = uVar19;
        do {
          plVar11 = (long *)local_50[uVar22];
          pcVar5 = *(code **)(*plVar11 + 0x18);
          *(undefined8 *)((long)&uStack_80 + lVar6) = 0x108074;
          cVar8 = (*pcVar5)(plVar11);
          pcVar5 = *(code **)(*plVar11 + 0x30);
          *(undefined8 *)((long)&uStack_80 + lVar6) = 0x108080;
          pvVar12 = (void *)(*pcVar5)(plVar11);
          uVar19 = local_34;
          iVar20 = local_40;
          iVar18 = local_44;
          iVar9 = local_54;
          if (cVar8 == '\0') {
            DVar3 = this->_dt;
            *(ulong *)((long)&uStack_80 + lVar6) = (ulong)(uint)this->_nchan;
            *(ulong *)((long)aDStack_88 + lVar6) = (ulong)DVar3;
            pRVar7 = local_70;
            *(undefined8 *)((long)&uStack_90 + lVar6) = 0x1080c9;
            (*pRVar7)(pvVar12,iVar9,iVar18,iVar20,pPVar14,uVar19,
                      *(DataType *)((long)aDStack_88 + lVar6),*(int *)((long)&uStack_80 + lVar6));
          }
          else {
            iVar18 = (int)local_48 / this->_ntilesu;
            iVar20 = (int)local_38 / this->_ntilesv;
            iVar9 = this->_pixelsize;
            *(undefined8 *)((long)&uStack_80 + lVar6) = 0x1080aa;
            PtexUtils::fill(pvVar12,pPVar14,uVar19,iVar18,iVar20,iVar9);
          }
          uVar22 = uVar22 + 1;
          iVar9 = local_3c;
          if ((int)((long)((ulong)(uint)((int)uVar22 >> 0x1f) << 0x20 | uVar22 & 0xffffffff) %
                   (long)this->_ntilesu) != 0) {
            iVar9 = (int)local_60;
          }
          pPVar14 = (PtexReader *)
                    ((long)&(pPVar14->super_PtexTexture)._vptr_PtexTexture + (long)iVar9);
          puVar21 = local_50;
        } while ((long)uVar22 < (long)this->_ntiles);
      }
    }
    if (0 < this->_ntiles) {
      lVar23 = 0;
      do {
        pcVar5 = *(code **)(*(long *)puVar21[lVar23] + 0x10);
        *(undefined8 *)((long)&uStack_80 + lVar6) = 0x1082ac;
        (*pcVar5)();
        lVar23 = lVar23 + 1;
      } while (lVar23 < this->_ntiles);
    }
  }
  else {
    uStack_80 = 0x107ec5;
    pTVar13 = (TiledFaceBase *)operator_new(0x60);
    uStack_80 = 0x107eda;
    TiledFaceBase(pTVar13,this->_reader,SUB42(local_3c,0),
                  (Res)((ushort)(uVar19 << 8) | (ushort)bVar17));
    (pTVar13->super_FaceData).super_PtexFaceData._vptr_PtexFaceData =
         (_func_int **)&PTR__TiledFaceBase_0011d718;
    pTVar13[1].super_FaceData.super_PtexFaceData._vptr_PtexFaceData = (_func_int **)this;
    *(ReduceFn **)&pTVar13[1].super_FaceData._res = local_70;
    *newMemUsed = (long)(pTVar13->_tiles).
                        super__Vector_base<Ptex::v2_4::PtexReader::FaceData_*,_std::allocator<Ptex::v2_4::PtexReader::FaceData_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish +
                  (0x60 - (long)(pTVar13->_tiles).
                                super__Vector_base<Ptex::v2_4::PtexReader::FaceData_*,_std::allocator<Ptex::v2_4::PtexReader::FaceData_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
    local_68 = pTVar13;
  }
  return &local_68->super_FaceData;
}

Assistant:

PtexReader::FaceData*
PtexReader::TiledFaceBase::reduce(PtexReader* r, Res newres, PtexUtils::ReduceFn reducefn,
                                  size_t& newMemUsed)
{
    /* Tiled reductions should generally only be anisotropic (just u
       or v, not both) since isotropic reductions are precomputed and
       stored on disk.  (This function should still work for isotropic
       reductions though.)

       In the anisotropic case, the number of tiles should be kept the
       same along the direction not being reduced in order to preserve
       the laziness of the file access.  In contrast, if reductions
       were not tiled, then any reduction would read all the tiles and
       defeat the purpose of tiling.
    */

    // keep new face local until fully initialized
    FaceData* newface = 0;

    // don't tile triangle reductions (too complicated)
    Res newtileres;
    bool isTriangle = r->_header.meshtype == mt_triangle;
    if (isTriangle) {
        newtileres = newres;
    }
    else {
        // propagate the tile res to the reduction
        newtileres = _tileres;
        // but make sure tile isn't larger than the new face!
        if (newtileres.ulog2 > newres.ulog2) newtileres.ulog2 = newres.ulog2;
        if (newtileres.vlog2 > newres.vlog2) newtileres.vlog2 = newres.vlog2;
    }


    // determine how many tiles we will have on the reduction
    int newntiles = newres.ntiles(newtileres);

    if (newntiles == 1) {
        // no need to keep tiling, reduce tiles into a single face
        // first, get all tiles and check if they are constant (with the same value)
        PtexFaceData** tiles = (PtexFaceData**) alloca(_ntiles * sizeof(PtexFaceData*));
        bool allConstant = true;
        for (int i = 0; i < _ntiles; i++) {
            PtexFaceData* tile = tiles[i] = getTile(i);
            allConstant = (allConstant && tile->isConstant() &&
                           (i == 0 || (0 == memcmp(tiles[0]->getData(), tile->getData(),
                                                   _pixelsize))));
        }
        if (allConstant) {
            // allocate a new constant face
            newface = new ConstantFace(_pixelsize);
            memcpy(newface->getData(), tiles[0]->getData(), _pixelsize);
            newMemUsed = sizeof(ConstantFace) + _pixelsize;
        }
        else if (isTriangle) {
            // reassemble all tiles into temporary contiguous image
            // (triangle reduction doesn't work on tiles)
            int tileures = _tileres.u();
            int tilevres = _tileres.v();
            int sstride = _pixelsize * tileures;
            int dstride = sstride * _ntilesu;
            int dstepv = dstride * tilevres - sstride*(_ntilesu-1);

            char* tmp = new char [_ntiles * _tileres.size() * _pixelsize];
            char* tmpptr = tmp;
            for (int i = 0; i < _ntiles;) {
                PtexFaceData* tile = tiles[i];
                if (tile->isConstant())
                    PtexUtils::fill(tile->getData(), tmpptr, dstride,
                                    tileures, tilevres, _pixelsize);
                else
                    PtexUtils::copy(tile->getData(), sstride, tmpptr, dstride, tilevres, sstride);
                i++;
                tmpptr += (i%_ntilesu) ? sstride : dstepv;
            }

            // allocate a new packed face
            int memsize = _pixelsize * newres.size();
            newface = new PackedFace(newres, _pixelsize, memsize);
            newMemUsed = sizeof(PackedFace) + memsize;
            // reduce and copy into new face
            reducefn(tmp, _pixelsize * _res.u(), _res.u(), _res.v(),
                     newface->getData(), _pixelsize * newres.u(), _dt, _nchan);

            delete [] tmp;
        }
        else {
            // allocate a new packed face
            int memsize = _pixelsize * newres.size();
            newface = new PackedFace(newres, _pixelsize, memsize);
            newMemUsed = sizeof(PackedFace) + memsize;

            int tileures = _tileres.u();
            int tilevres = _tileres.v();
            int sstride = _pixelsize * tileures;
            int dstride = _pixelsize * newres.u();
            int dstepu = dstride/_ntilesu;
            int dstepv = dstride*newres.v()/_ntilesv - dstepu*(_ntilesu-1);

            char* dst = (char*) newface->getData();
            for (int i = 0; i < _ntiles;) {
                PtexFaceData* tile = tiles[i];
                if (tile->isConstant())
                    PtexUtils::fill(tile->getData(), dst, dstride,
                                    newres.u()/_ntilesu, newres.v()/_ntilesv,
                                    _pixelsize);
                else
                    reducefn(tile->getData(), sstride, tileures, tilevres,
                             dst, dstride, _dt, _nchan);
                i++;
                dst += (i%_ntilesu) ? dstepu : dstepv;
            }
        }
        // release the tiles
        for (int i = 0; i < _ntiles; i++) tiles[i]->release();
    }
    else {
        // otherwise, tile the reduced face
        TiledReducedFace* tf = new TiledReducedFace(_reader, newres, newtileres, this, reducefn);
        newface = tf;
        newMemUsed = tf->memUsed();
    }
    return newface;
}